

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void enter_reuse_via_separate_kvs_test(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  fdb_status s_10;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_status s_1;
  fdb_status s;
  fdb_config fconfig;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  sb_decision_t sb_decision;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status status;
  char bodybuf [512];
  char keybuf [256];
  int nheaders;
  int ndocs;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffff998;
  undefined2 uVar3;
  undefined2 in_stack_fffffffffffff99a;
  undefined2 uVar4;
  undefined4 in_stack_fffffffffffff99c;
  fdb_iterator *in_stack_fffffffffffff9a8;
  FILE *pFVar5;
  size_t in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  fdb_kvs_handle *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  fdb_kvs_handle *in_stack_fffffffffffff9d8;
  fdb_doc **in_stack_fffffffffffffa10;
  fdb_iterator *in_stack_fffffffffffffa18;
  fdb_kvs_config *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  fdb_kvs_handle **in_stack_fffffffffffffb50;
  fdb_file_handle *in_stack_fffffffffffffb58;
  fdb_config *in_stack_fffffffffffffbb8;
  char *pcVar6;
  fdb_file_handle **in_stack_fffffffffffffbc8;
  ulong local_3c0;
  fdb_iterator *local_398;
  undefined8 local_390;
  fdb_kvs_handle *local_388;
  fdb_status local_36c;
  fdb_doc *local_368 [64];
  char local_168 [264];
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_60 = 10;
  local_390 = 0;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  pcVar6 = (char *)0x23;
  local_58 = system("rm -rf  staleblktest* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffbc8,pcVar6,in_stack_fffffffffffffbb8);
  fdb_kvs_open(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               in_stack_fffffffffffffb40);
  fdb_kvs_open(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               in_stack_fffffffffffffb40);
  for (local_54 = 0; (int)local_54 < local_60; local_54 = local_54 + 1) {
    sprintf(local_168,"%dkey",(ulong)local_54);
    fillstr((char *)local_368,'a',0xc);
    strlen(local_168);
    strlen((char *)local_368);
    fVar1 = fdb_set_kv(in_stack_fffffffffffff9d8,
                       (void *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (size_t)in_stack_fffffffffffff9c8,
                       (void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       in_stack_fffffffffffff9b8);
    pFVar5 = _stderr;
    local_36c = fVar1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x58f);
      enter_reuse_via_separate_kvs_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x58f,"void enter_reuse_via_separate_kvs_test()");
    }
    strlen(local_168);
    strlen((char *)local_368);
    fVar1 = fdb_set_kv(in_stack_fffffffffffff9d8,
                       (void *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (size_t)in_stack_fffffffffffff9c8,
                       (void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       in_stack_fffffffffffff9b8);
    pFVar5 = _stderr;
    local_36c = fVar1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x592);
      enter_reuse_via_separate_kvs_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x592,"void enter_reuse_via_separate_kvs_test()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)
                       CONCAT44(in_stack_fffffffffffff99c,
                                CONCAT22(in_stack_fffffffffffff99a,in_stack_fffffffffffff998)),'\0')
    ;
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      local_36c = fVar1;
      pcVar6 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x594);
      enter_reuse_via_separate_kvs_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x594,"void enter_reuse_via_separate_kvs_test()");
    }
    local_36c = 0;
  }
  local_54 = 0;
  do {
    sprintf(local_168,"0key");
    fillstr((char *)local_368,'b',0x80);
    strlen(local_168);
    strlen((char *)local_368);
    fVar1 = fdb_set_kv(in_stack_fffffffffffff9d8,
                       (void *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (size_t)in_stack_fffffffffffff9c8,
                       (void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       in_stack_fffffffffffff9b8);
    pFVar5 = _stderr;
    local_36c = fVar1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar6 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x59e);
      enter_reuse_via_separate_kvs_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x59e,"void enter_reuse_via_separate_kvs_test()");
    }
    local_54 = local_54 + 1;
    fVar1 = fdb_get_file_info((fdb_file_handle *)in_stack_fffffffffffff9d8,
                              (fdb_file_info *)
                              CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      local_36c = fVar1;
      pcVar6 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x5a1);
      enter_reuse_via_separate_kvs_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x5a1,"void enter_reuse_via_separate_kvs_test()");
    }
    local_36c = 0;
  } while (local_3c0 < 0x1000000);
  local_5c = local_54;
  local_36c = fVar1;
  sVar2 = sb_check_block_reusing(in_stack_fffffffffffff9c8);
  if (sVar2 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x5a6);
    enter_reuse_via_separate_kvs_test::__test_pass = 0;
    if (sVar2 != SBD_RECLAIM) {
      __assert_fail("sb_decision == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x5a6,"void enter_reuse_via_separate_kvs_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)
                     CONCAT44(in_stack_fffffffffffff99c,
                              CONCAT22(in_stack_fffffffffffff99a,in_stack_fffffffffffff998)),'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar5 = _stderr;
    local_36c = fVar1;
    pcVar6 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x5aa);
    enter_reuse_via_separate_kvs_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x5aa,"void enter_reuse_via_separate_kvs_test()");
  }
  for (local_54 = 0; local_36c = 0, (int)local_54 < local_5c; local_54 = local_54 + 1) {
    sprintf(local_168,"key%d",(ulong)local_54);
    fillstr((char *)local_368,'c',0x80);
    strlen(local_168);
    in_stack_fffffffffffffa10 = local_368;
    strlen((char *)local_368);
    fVar1 = fdb_set_kv(in_stack_fffffffffffff9d8,
                       (void *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (size_t)in_stack_fffffffffffff9c8,
                       (void *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       in_stack_fffffffffffff9b8);
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      local_36c = fVar1;
      pcVar6 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x5b2);
      enter_reuse_via_separate_kvs_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x5b2,"void enter_reuse_via_separate_kvs_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)
                     CONCAT44(in_stack_fffffffffffff99c,
                              CONCAT22(in_stack_fffffffffffff99a,in_stack_fffffffffffff998)),'\0');
  local_36c = fVar1;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar5 = _stderr;
    pcVar6 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x5b5);
    enter_reuse_via_separate_kvs_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x5b5,"void enter_reuse_via_separate_kvs_test()");
  }
  uVar3 = 0;
  uVar4 = 0;
  fdb_iterator_init(local_388,&local_398,(void *)0x0,0,(void *)0x0,0,0);
  local_54 = 0;
  do {
    local_36c = fdb_iterator_get(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    if (local_36c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x5bc);
      enter_reuse_via_separate_kvs_test::__test_pass = 0;
      if (local_36c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x5bc,"void enter_reuse_via_separate_kvs_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x110adb);
    local_390 = 0;
    local_54 = local_54 + 1;
    fVar1 = fdb_iterator_next((fdb_iterator *)
                              CONCAT44(in_stack_fffffffffffff99c,CONCAT22(uVar4,uVar3)));
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  if (local_54 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x5c1);
    enter_reuse_via_separate_kvs_test::__test_pass = 0;
    if (local_54 != 10) {
      __assert_fail("i==10",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x5c1,"void enter_reuse_via_separate_kvs_test()");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffff9a8);
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffff99c,CONCAT22(uVar4,uVar3)))
  ;
  local_36c = fVar1;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_close((fdb_kvs_handle *)
                          CONCAT44(in_stack_fffffffffffff99c,CONCAT22(uVar4,uVar3)));
    local_36c = fVar1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar5 = _stderr;
      pcVar6 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x5c7);
      enter_reuse_via_separate_kvs_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x5c7,"void enter_reuse_via_separate_kvs_test()");
    }
    fVar1 = fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffff99c,CONCAT22(uVar4,uVar3)));
    local_36c = fVar1;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      if (enter_reuse_via_separate_kvs_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","enter reuse via separate kvs test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","enter reuse via separate kvs test");
      }
      return;
    }
    pFVar5 = _stderr;
    pcVar6 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x5c9);
    enter_reuse_via_separate_kvs_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x5c9,"void enter_reuse_via_separate_kvs_test()");
  }
  pFVar5 = _stderr;
  pcVar6 = fdb_error_msg(fVar1);
  fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar6,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x5c5);
  enter_reuse_via_separate_kvs_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x5c5,"void enter_reuse_via_separate_kvs_test()");
}

Assistant:

void enter_reuse_via_separate_kvs_test() {
    TEST_INIT();
    memleak_start();

    int i, r, ndocs;
    int nheaders = 10;
    char keybuf[256];
    char bodybuf[512];

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc *rdoc = NULL;
    fdb_iterator *iterator;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 35;
    fconfig.num_keeping_headers = nheaders;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);

    // load docs into db and db2
    for (i = 0; i < nheaders; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'a', 12);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_set_kv(db2, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // enter reuse via db
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'b', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    ndocs = i;

    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // reuse blocks
    for (i = 0; i < ndocs; i++) {
        sprintf(keybuf, "key%d", i);
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // check that docs from db2 not lost
    fdb_iterator_init(db2, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    i = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);
    fdb_iterator_close(iterator);

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db2);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("enter reuse via separate kvs test");
}